

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MachineBlocker.cpp
# Opt level: O2

bool __thiscall ApprovalTests::MachineBlocker::isBlockingOnThisMachine(MachineBlocker *this)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  SystemUtils::getMachineName_abi_cxx11_();
  _Var1 = ::std::operator==(&bStack_38,&this->machineName);
  ::std::__cxx11::string::~string((string *)&bStack_38);
  return this->block == _Var1;
}

Assistant:

bool MachineBlocker::isBlockingOnThisMachine() const
    {
        const auto isMachine = (SystemUtils::getMachineName() == machineName);
        return isMachine == block;
    }